

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::GetLineFromStream
               (istream *is,string *line,bool *has_newline,long sizeLimit)

{
  undefined8 uVar1;
  bool bVar2;
  _Ios_Iostate __a;
  _Ios_Iostate __b;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  size_t length;
  long leftToRead;
  char local_438 [6];
  bool haveNewline;
  bool haveData;
  char buffer [1024];
  int bufferSize;
  long sizeLimit_local;
  bool *has_newline_local;
  string *line_local;
  istream *is_local;
  
  buffer[0x3fc] = '\0';
  buffer[0x3fd] = '\x04';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  leftToRead._7_1_ = 0;
  leftToRead._6_1_ = 0;
  std::__cxx11::string::operator=((string *)line,"");
  uVar3 = std::ios::operator!((ios *)(is + *(long *)(*(long *)is + -0x18)));
  length = sizeLimit;
  if ((uVar3 & 1) == 0) {
    while( true ) {
      bVar2 = false;
      if (((leftToRead._6_1_ & 1) == 0) && (bVar2 = false, length != 0)) {
        uVar1 = *(undefined8 *)(*(long *)is + -0x18);
        __a = std::ios::rdstate();
        __b = std::operator~(_S_failbit);
        std::operator&(__a,__b);
        std::ios::clear((int)is + (int)uVar1);
        std::istream::getline((char *)is,(long)local_438);
        lVar4 = std::istream::gcount();
        bVar2 = 0 < lVar4;
      }
      if (!bVar2) break;
      leftToRead._7_1_ = 1;
      sVar5 = strlen(local_438);
      uVar3 = std::istream::gcount();
      if (sVar5 < uVar3) {
        leftToRead._6_1_ = 1;
      }
      if ((sVar5 != 0) && (local_438[sVar5 - 1] == '\r')) {
        local_438[sVar5 - 1] = '\0';
      }
      if (0 < (long)length) {
        if ((long)length < (long)sVar5) {
          local_438[length - 1] = '\0';
          length = 0;
        }
        else {
          length = length - sVar5;
        }
      }
      std::__cxx11::string::append((char *)line);
    }
    if (has_newline != (bool *)0x0) {
      *has_newline = (bool)(leftToRead._6_1_ & 1);
    }
    is_local._7_1_ = (bool)(leftToRead._7_1_ & 1);
  }
  else {
    if (has_newline != (bool *)0x0) {
      *has_newline = false;
    }
    is_local._7_1_ = false;
  }
  return is_local._7_1_;
}

Assistant:

bool SystemTools::GetLineFromStream(kwsys_ios::istream& is,
                                    kwsys_stl::string& line,
                                    bool* has_newline /* = 0 */,
                                    long sizeLimit /* = -1 */)
{
  const int bufferSize = 1024;
  char buffer[bufferSize];
  bool haveData = false;
  bool haveNewline = false;

  // Start with an empty line.
  line = "";

  long leftToRead = sizeLimit;

  // Early short circuit return if stream is no good. Just return
  // false and the empty line. (Probably means caller tried to
  // create a file stream with a non-existent file name...)
  //
  if(!is)
    {
    if(has_newline)
      {
      *has_newline = false;
      }
    return false;
    }

  // If no characters are read from the stream, the end of file has
  // been reached.  Clear the fail bit just before reading.
  while(!haveNewline &&
        leftToRead != 0 &&
        (is.clear(is.rdstate() & ~kwsys_ios::ios::failbit),
         is.getline(buffer, bufferSize), is.gcount() > 0))
    {
    // We have read at least one byte.
    haveData = true;

    // If newline character was read the gcount includes the character
    // but the buffer does not: the end of line has been reached.
    size_t length = strlen(buffer);
    if(length < static_cast<size_t>(is.gcount()))
      {
      haveNewline = true;
      }

    // Avoid storing a carriage return character.
    if(length > 0 && buffer[length-1] == '\r')
      {
      buffer[length-1] = 0;
      }

    // if we read too much then truncate the buffer
    if (leftToRead > 0)
      {
      if (static_cast<long>(length) > leftToRead)
        {
        buffer[leftToRead-1] = 0;
        leftToRead = 0;
        }
      else
        {
        leftToRead -= static_cast<long>(length);
        }
      }

    // Append the data read to the line.
    line.append(buffer);
    }

  // Return the results.
  if(has_newline)
    {
    *has_newline = haveNewline;
    }
  return haveData;
}